

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O3

void idx2::PrintStats(cstr MetaFileName)

{
  FILE *__s;
  ulong uVar1;
  undefined4 uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  uint uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  __s = fopen(MetaFileName,"a");
  fwrite("\n\n---------------- Statistics ----------------\n\n",0x30,1,__s);
  fprintf(__s,"num chunks = %li (bit plane) and %li (exponent) \n",_ZN4idx2L18BitPlaneChunksStatE_3,
          _ZN4idx2L23CompressedExpChunksStatE_3);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = _ZN4idx2L18BitPlaneChunksStatE_2;
  uVar3 = (uint)_ZN4idx2L18BitPlaneChunksStatE_2;
  auVar10._0_8_ = (double)_ZN4idx2L18BitPlaneChunksStatE_3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = _ZN4idx2L18BitPlaneChunksStatE_4;
  auVar5 = vunpcklpd_avx(auVar12,auVar5);
  auVar10._8_8_ = auVar10._0_8_;
  auVar5 = vdivpd_avx(auVar5,auVar10);
  auVar10 = vshufpd_avx(auVar5,auVar5,1);
  dVar9 = auVar10._0_8_;
  dVar4 = auVar5._0_8_ - dVar9 * dVar9;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar4;
    auVar5 = vsqrtsd_avx(auVar6,auVar6);
    dVar4 = auVar5._0_8_;
  }
  uVar1 = (ulong)(uint)(int)dVar9;
  fprintf(__s,"bit plane chunk: total = %d avg = %d stddev = %d bytes\n",(ulong)uVar3,uVar1,
          (int)dVar4);
  uVar2 = (undefined4)(uVar1 >> 0x20);
  fprintf(__s,"  (metadata) brick deltas = %d bytes\n",
          CONCAT44(extraout_var,(int)_ZN4idx2L15BrickDeltasStatE_2));
  fprintf(__s,"  (metadata) brick sizes = %d bytes\n",
          CONCAT44(extraout_var_00,(int)_ZN4idx2L14BrickSizesStatE_2));
  fprintf(__s,"  (metadata) chunk sizes = %d bytes\n",
          CONCAT44(extraout_var_01,(int)_ZN4idx2L14ChunkSizesStatE_2));
  fprintf(__s,"  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
          CONCAT44(extraout_var_02,(int)_ZN4idx2L30UncompressedChunkAddressesStatE_2),
          CONCAT44(uVar2,(int)_ZN4idx2L28CompressedChunkAddressesStatE_2));
  fwrite("exponent chunk:\n",0x10,1,__s);
  fprintf(__s,"  uncompressed: total = %d bytes\n",
          CONCAT44(extraout_var_03,(int)_ZN4idx2L25UncompressedExpChunksStatE_2));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = _ZN4idx2L23CompressedExpChunksStatE_2;
  uVar3 = (uint)_ZN4idx2L23CompressedExpChunksStatE_2;
  auVar11._0_8_ = (double)_ZN4idx2L23CompressedExpChunksStatE_3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = _ZN4idx2L23CompressedExpChunksStatE_4;
  auVar5 = vunpcklpd_avx(auVar13,auVar7);
  auVar11._8_8_ = auVar11._0_8_;
  auVar5 = vdivpd_avx(auVar5,auVar11);
  auVar10 = vshufpd_avx(auVar5,auVar5,1);
  dVar9 = auVar10._0_8_;
  dVar4 = auVar5._0_8_ - dVar9 * dVar9;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar4;
    auVar5 = vsqrtsd_avx(auVar8,auVar8);
    dVar4 = auVar5._0_8_;
  }
  uVar1 = (ulong)(uint)(int)dVar9;
  fprintf(__s,"  compressed: total = %d avg = %d stddev = %d bytes\n",(ulong)uVar3,uVar1,(int)dVar4)
  ;
  uVar2 = (undefined4)(uVar1 >> 0x20);
  fprintf(__s,"  (metadata) chunk sizes = %d bytes\n",
          CONCAT44(extraout_var_04,(int)_ZN4idx2L17ExpChunkSizesStatE_2));
  fprintf(__s,"  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
          CONCAT44(extraout_var_05,(int)_ZN4idx2L33UncompressedExpChunkAddressesStatE_2),
          CONCAT44(uVar2,(int)_ZN4idx2L31CompressedExpChunkAddressesStatE_2));
  fclose(__s);
  return;
}

Assistant:

void
PrintStats(cstr MetaFileName)
{
  FILE* Fp = fopen(MetaFileName, "a");
  fprintf(Fp, "\n\n---------------- Statistics ----------------\n\n");
  fprintf(Fp, "num chunks = %" PRIi64 " (bit plane) and %" PRIi64 " (exponent) \n", BitPlaneChunksStat.Count(), CompressedExpChunksStat.Count());
  fprintf(Fp, "bit plane chunk: total = %d avg = %d stddev = %d bytes\n",
         (int)BitPlaneChunksStat.Sum(),
         (int)BitPlaneChunksStat.Avg(),
         (int)BitPlaneChunksStat.StdDev());
  fprintf(Fp, "  (metadata) brick deltas = %d bytes\n", (int)BrickDeltasStat.Sum());
  fprintf(Fp, "  (metadata) brick sizes = %d bytes\n", (int)BrickSizesStat.Sum());
  fprintf(Fp, "  (metadata) chunk sizes = %d bytes\n", (int)ChunkSizesStat.Sum());
  fprintf(Fp, "  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
         (int)UncompressedChunkAddressesStat.Sum(), (int)CompressedChunkAddressesStat.Sum());
  fprintf(Fp, "exponent chunk:\n");
  fprintf(Fp, "  uncompressed: total = %d bytes\n", (int)UncompressedExpChunksStat.Sum());
  fprintf(Fp, "  compressed: total = %d avg = %d stddev = %d bytes\n",
         (int) CompressedExpChunksStat.Sum(),
         (int) CompressedExpChunksStat.Avg(),
         (int) CompressedExpChunksStat.StdDev());
  fprintf(Fp, "  (metadata) chunk sizes = %d bytes\n", (int)ExpChunkSizesStat.Sum());
  fprintf(Fp, "  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
         (int)UncompressedExpChunkAddressesStat.Sum(), (int)CompressedExpChunkAddressesStat.Sum());
  fclose(Fp);
}